

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall cmFindPackageCommand::FillPrefixesSystemRegistry(cmFindPackageCommand *this)

{
  mapped_type *searchPath;
  string debugBuffer;
  string local_50;
  string local_30;
  
  if (((this->NoSystemRegistry == false) && ((this->super_cmFindCommon).NoDefaultPath == false)) &&
     ((this->super_cmFindCommon).DebugMode == true)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,
               "CMake System Package Registry [CMAKE_FIND_PACKAGE_NO_SYSTEM_PACKAGE_REGISTRY].\n",
               (allocator<char> *)&local_30);
    searchPath = std::
                 map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
                 ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                              &PathLabel::SystemRegistry.super_PathLabel);
    anon_unknown.dwarf_485276::collectPathsForDebug(&local_50,searchPath,0);
    cmStrCat<std::__cxx11::string&,std::__cxx11::string&>(&local_30,&this->DebugBuffer,&local_50);
    std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void cmFindPackageCommand::FillPrefixesSystemRegistry()
{
  if (this->NoSystemRegistry || this->NoDefaultPath) {
    return;
  }

#if defined(_WIN32) && !defined(__CYGWIN__)
  this->LoadPackageRegistryWinSystem();
#endif

  if (this->DebugMode) {
    std::string debugBuffer =
      "CMake System Package Registry "
      "[CMAKE_FIND_PACKAGE_NO_SYSTEM_PACKAGE_REGISTRY].\n";
    collectPathsForDebug(debugBuffer,
                         this->LabeledPaths[PathLabel::SystemRegistry]);
    this->DebugBuffer = cmStrCat(this->DebugBuffer, debugBuffer);
  }
}